

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase60::run(TestCase60 *this)

{
  unsigned_short uVar1;
  _func_int **pp_Var2;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StructSchema schema;
  int local_128;
  unsigned_short local_122;
  Schema local_120;
  Schema local_118;
  DebugComparison<int,_unsigned_short> _kjCondition;
  Maybe<capnp::StructSchema::Field> local_f0;
  DebugComparison<kj::Maybe<capnp::StructSchema::Field>,_const_kj::None_&> local_a8;
  SchemaLoader loader;
  
  SchemaLoader::SchemaLoader(&loader);
  _kjCondition.left = 0x6c0aa8;
  _kjCondition.right = 0;
  _kjCondition._6_2_ = 0;
  Schema::getProto((Reader *)&local_a8,(Schema *)&_kjCondition);
  local_f0.ptr._0_8_ = SchemaLoader::load(&loader,(Reader *)&local_a8);
  schema = Schema::asStruct((Schema *)&local_f0);
  _kjCondition.left = 0x6c0b30;
  _kjCondition.right = 0;
  _kjCondition._6_2_ = 0;
  Schema::getProto((Reader *)&local_a8,(Schema *)&_kjCondition);
  local_f0.ptr._0_8_ = SchemaLoader::load(&loader,(Reader *)&local_a8);
  Schema::asStruct((Schema *)&local_f0);
  _kjCondition.left = 0x6c0bb8;
  _kjCondition.right = 0;
  _kjCondition._6_2_ = 0;
  Schema::getProto((Reader *)&local_a8,(Schema *)&_kjCondition);
  local_f0.ptr._0_8_ = SchemaLoader::load(&loader,(Reader *)&local_a8);
  Schema::asStruct((Schema *)&local_f0);
  name.content.size_ = 9;
  name.content.ptr = "theUnion";
  StructSchema::getFieldByName((Field *)&local_f0,&schema,name);
  if ((uint)local_f0.ptr.field_1._40_4_ < 0xc0) {
    pp_Var2 = (_func_int **)0x0;
  }
  else {
    pp_Var2 = local_f0.ptr.field_1.value.proto._reader.capTable[2]._vptr_CapTableReader;
  }
  local_120 = Schema::getDependency(&schema.super_Schema,(uint64_t)pp_Var2,0);
  local_118.raw = (RawBrandedSchema *)Schema::asStruct(&local_120);
  name_00.content.size_ = 7;
  name_00.content.ptr = "grault";
  StructSchema::getFieldByName((Field *)&local_a8,(StructSchema *)&local_118,name_00);
  if ((uint)local_a8.left.ptr.field_1._40_4_ < 0x70) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(unsigned_short *)
             ((long)&local_a8.left.ptr.field_1.value.proto._reader.capTable[1]._vptr_CapTableReader
             + 4);
  }
  _kjCondition.right = uVar1;
  _kjCondition.left = 6;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = uVar1 == 6;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_128 = 6;
    name_01.content.size_ = 9;
    name_01.content.ptr = "theUnion";
    StructSchema::getFieldByName((Field *)&local_f0,&schema,name_01);
    if ((uint)local_f0.ptr.field_1._40_4_ < 0xc0) {
      pp_Var2 = (_func_int **)0x0;
    }
    else {
      pp_Var2 = local_f0.ptr.field_1.value.proto._reader.capTable[2]._vptr_CapTableReader;
    }
    local_120 = Schema::getDependency(&schema.super_Schema,(uint64_t)pp_Var2,0);
    local_118.raw = (RawBrandedSchema *)Schema::asStruct(&local_120);
    name_02.content.size_ = 7;
    name_02.content.ptr = "grault";
    StructSchema::getFieldByName((Field *)&local_a8,(StructSchema *)&local_118,name_02);
    if ((uint)local_a8.left.ptr.field_1._40_4_ < 0x70) {
      local_122 = 0;
    }
    else {
      local_122 = *(unsigned_short *)
                   ((long)&local_a8.left.ptr.field_1.value.proto._reader.capTable[1].
                           _vptr_CapTableReader + 4);
    }
    kj::_::Debug::
    log<char_const(&)[191],kj::_::DebugComparison<int,unsigned_short>&,int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x46,ERROR,
               "\"failed: expected \" \"(6) == (schema.getDependency(schema.getFieldByName(\\\"theUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"grault\\\").getProto().getOrdinal().getExplicit())\", _kjCondition, 6, schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit()"
               ,(char (*) [191])
                "failed: expected (6) == (schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit())"
               ,&_kjCondition,&local_128,&local_122);
  }
  name_03.content.size_ = 0xd;
  name_03.content.ptr = "anotherUnion";
  StructSchema::getFieldByName((Field *)&local_f0,&schema,name_03);
  if ((uint)local_f0.ptr.field_1._40_4_ < 0xc0) {
    pp_Var2 = (_func_int **)0x0;
  }
  else {
    pp_Var2 = local_f0.ptr.field_1.value.proto._reader.capTable[2]._vptr_CapTableReader;
  }
  local_120 = Schema::getDependency(&schema.super_Schema,(uint64_t)pp_Var2,0);
  local_118.raw = (RawBrandedSchema *)Schema::asStruct(&local_120);
  name_04.content.size_ = 6;
  name_04.content.ptr = "corge";
  StructSchema::getFieldByName((Field *)&local_a8,(StructSchema *)&local_118,name_04);
  if ((uint)local_a8.left.ptr.field_1._40_4_ < 0x70) {
    _kjCondition.right = 0;
  }
  else {
    _kjCondition.right =
         *(unsigned_short *)
          ((long)&local_a8.left.ptr.field_1.value.proto._reader.capTable[1]._vptr_CapTableReader + 4
          );
  }
  _kjCondition.left = 9;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == 9;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    local_128 = 9;
    name_05.content.size_ = 0xd;
    name_05.content.ptr = "anotherUnion";
    StructSchema::getFieldByName((Field *)&local_f0,&schema,name_05);
    if ((uint)local_f0.ptr.field_1._40_4_ < 0xc0) {
      pp_Var2 = (_func_int **)0x0;
    }
    else {
      pp_Var2 = local_f0.ptr.field_1.value.proto._reader.capTable[2]._vptr_CapTableReader;
    }
    local_120 = Schema::getDependency(&schema.super_Schema,(uint64_t)pp_Var2,0);
    local_118.raw = (RawBrandedSchema *)Schema::asStruct(&local_120);
    name_06.content.size_ = 6;
    name_06.content.ptr = "corge";
    StructSchema::getFieldByName((Field *)&local_a8,(StructSchema *)&local_118,name_06);
    if ((uint)local_a8.left.ptr.field_1._40_4_ < 0x70) {
      local_122 = 0;
    }
    else {
      local_122 = *(unsigned_short *)
                   ((long)&local_a8.left.ptr.field_1.value.proto._reader.capTable[1].
                           _vptr_CapTableReader + 4);
    }
    kj::_::Debug::
    log<char_const(&)[194],kj::_::DebugComparison<int,unsigned_short>&,int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x49,ERROR,
               "\"failed: expected \" \"(9) == (schema.getDependency(schema.getFieldByName(\\\"anotherUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"corge\\\").getProto().getOrdinal().getExplicit())\", _kjCondition, 9, schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit()"
               ,(char (*) [194])
                "failed: expected (9) == (schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit())"
               ,&_kjCondition,&local_128,&local_122);
  }
  name_07.content.size_ = 6;
  name_07.content.ptr = "corge";
  StructSchema::findFieldByName(&local_f0,&schema,name_07);
  if (local_f0.ptr.isSet == true) {
    local_a8.left.ptr.field_1._48_8_ = local_f0.ptr.field_1._48_8_;
    local_a8.left.ptr.field_1._56_8_ = local_f0.ptr.field_1._56_8_;
    local_a8.left.ptr.field_1.value.proto._reader.data =
         local_f0.ptr.field_1.value.proto._reader.data;
    local_a8.left.ptr.field_1.value.proto._reader.segment =
         local_f0.ptr.field_1.value.proto._reader.segment;
    local_a8.left.ptr.field_1.value.proto._reader.capTable =
         local_f0.ptr.field_1.value.proto._reader.capTable;
    local_a8.left.ptr.field_1.value.parent.super_Schema.raw =
         local_f0.ptr.field_1.value.parent.super_Schema.raw;
    local_a8.left.ptr.field_1._8_8_ = local_f0.ptr.field_1._8_8_;
  }
  local_a8.left.ptr.isSet = local_f0.ptr.isSet;
  local_a8.result = (bool)(local_f0.ptr.isSet ^ 1);
  local_a8.right = (None *)&kj::none;
  local_a8.op.content.ptr = " == ";
  local_a8.op.content.size_ = 5;
  if ((local_f0.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x4a,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"corge\\\") == kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected schema.findFieldByName(\"corge\") == kj::none",
               &local_a8);
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "grault";
  StructSchema::findFieldByName(&local_f0,&schema,name_08);
  if (local_f0.ptr.isSet == true) {
    local_a8.left.ptr.field_1._48_8_ = local_f0.ptr.field_1._48_8_;
    local_a8.left.ptr.field_1._56_8_ = local_f0.ptr.field_1._56_8_;
    local_a8.left.ptr.field_1.value.proto._reader.data =
         local_f0.ptr.field_1.value.proto._reader.data;
    local_a8.left.ptr.field_1.value.proto._reader.segment =
         local_f0.ptr.field_1.value.proto._reader.segment;
    local_a8.left.ptr.field_1.value.proto._reader.capTable =
         local_f0.ptr.field_1.value.proto._reader.capTable;
    local_a8.left.ptr.field_1.value.parent.super_Schema.raw =
         local_f0.ptr.field_1.value.parent.super_Schema.raw;
    local_a8.left.ptr.field_1._8_8_ = local_f0.ptr.field_1._8_8_;
  }
  local_a8.left.ptr.isSet = local_f0.ptr.isSet;
  local_a8.result = (bool)(local_f0.ptr.isSet ^ 1);
  local_a8.right = (None *)&kj::none;
  local_a8.op.content.ptr = " == ";
  local_a8.op.content.size_ = 5;
  if ((local_f0.ptr.isSet != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<capnp::StructSchema::Field>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x4b,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"grault\\\") == kj::none\", _kjCondition"
               ,(char (*) [62])"failed: expected schema.findFieldByName(\"grault\") == kj::none",
               &local_a8);
  }
  SchemaLoader::~SchemaLoader(&loader);
  return;
}

Assistant:

TEST(SchemaLoader, LoadLateUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestLateUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::TheUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::AnotherUnion>().getProto()).asStruct();

  EXPECT_EQ(6,
      schema.getDependency(schema.getFieldByName("theUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("grault").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(9,
      schema.getDependency(schema.getFieldByName("anotherUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("corge").getProto().getOrdinal().getExplicit());
  EXPECT_TRUE(schema.findFieldByName("corge") == kj::none);
  EXPECT_TRUE(schema.findFieldByName("grault") == kj::none);
}